

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O1

int duckdb::DecimalScaleUpCheckOperator::Operation<short,int>
              (short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  short sVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint8_t in_R8B;
  undefined7 in_register_00000081;
  unkbyte10 Var5;
  int result;
  string error;
  int local_ac;
  string local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  
  sVar1 = *(short *)((long)dataptr + 0x20);
  uVar4 = (uint)input;
  if ((input < sVar1) &&
     (uVar3 = -(int)sVar1, uVar4 != uVar3 && SBORROW4(uVar4,uVar3) == (int)(uVar4 + (int)sVar1) < 0)
     ) {
    bVar2 = TryCast::Operation<short,int>(input,&local_ac,false);
    if (!bVar2) {
      Var5 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,int>
                (&local_a8,(duckdb *)(ulong)uVar4,(short)((unkuint10)Var5 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var5,(string *)&local_a8);
      __cxa_throw((InvalidInputException *)Var5,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    local_ac = local_ac * *(int *)((long)dataptr + 0x24);
  }
  else {
    local_88[0] = local_78;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Casting value \"%s\" to type %s failed: value is out of range!",
               "");
    Decimal::ToString_abi_cxx11_
              (&local_48,(Decimal *)(ulong)uVar4,(ushort)*(byte *)((long)dataptr + 0x28),
               *(uint8_t *)((long)dataptr + 0x29),in_R8B);
    LogicalType::ToString_abi_cxx11_(&local_68,(LogicalType *)(*dataptr + 8));
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (&local_a8,(StringUtil *)local_88,&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_register_00000081,in_R8B));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    local_ac = HandleVectorCastError::Operation<int>
                         (&local_a8,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  return local_ac;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		if (input >= data->limit || input <= -data->limit) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}